

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool c4::yml::anon_unknown_0::_is_scalar_next__rmap_val(csubstr s)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong in_RSI;
  char *in_RDI;
  basic_substring<const_char> local_10;
  
  if ((1 < in_RSI) && (*in_RDI == '-')) {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 1) break;
      lVar1 = lVar3 + 1;
    } while (in_RDI[lVar3 + 1] == "--- "[lVar3 + 3]);
    if (lVar3 != 0) {
      return false;
    }
  }
  if (in_RSI == 0) {
LAB_0022aef9:
    iVar2 = basic_substring<const_char>::compare(&local_10,"-",1);
    return iVar2 != 0;
  }
  if (*in_RDI != '{') {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 1) break;
      lVar1 = lVar3 + 1;
    } while (*in_RDI != "{["[lVar3 + 1]);
    if (lVar3 != 0) goto LAB_0022aef9;
  }
  return false;
}

Assistant:

bool _is_scalar_next__rmap_val(csubstr s)
{
    return !(s.begins_with("- ") || s.begins_with_any("{[") || s == "-");
}